

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void __thiscall
sznet::Logger::Impl::Impl(Impl *this,LogLevel level,int savedErrno,SourceFile *file,int line)

{
  int iVar1;
  undefined4 uVar2;
  Timestamp TVar3;
  char *pcVar4;
  self *this_00;
  LogStream *pLVar5;
  char **ppcVar6;
  ulong uVar7;
  uint *in_FS_OFFSET;
  T local_58;
  T local_48;
  LogStream *local_38;
  
  TVar3 = Timestamp::now();
  (this->m_time).m_microSecondsSinceEpoch = TVar3.m_microSecondsSinceEpoch;
  local_38 = &this->m_stream;
  memset(local_38,0,0xfb0);
  (this->m_stream).m_buffer.m_cur = (this->m_stream).m_buffer.m_data;
  this->m_level = level;
  this->m_line = line;
  iVar1 = file->m_size;
  uVar2 = *(undefined4 *)&file->field_0xc;
  (this->m_basename).m_data = file->m_data;
  (this->m_basename).m_size = iVar1;
  *(undefined4 *)&(this->m_basename).field_0xc = uVar2;
  formatTime(this);
  sznet::CurrentThread::t_cachedTid::__tls_init();
  if (*in_FS_OFFSET == 0) {
    CurrentThread::cacheTid();
  }
  sznet::CurrentThread::t_cachedTid::__tls_init();
  sznet::CurrentThread::t_tidString::__tls_init();
  ppcVar6 = &(this->m_stream).m_buffer.m_cur;
  pcVar4 = *(char **)in_FS_OFFSET;
  sznet::CurrentThread::t_tidStringLength::__tls_init();
  T::T(&local_58,pcVar4,*in_FS_OFFSET);
  uVar7 = (ulong)(int)local_58.m_len;
  if (uVar7 < (ulong)(long)((int)ppcVar6 - (int)*ppcVar6)) {
    memcpy(*ppcVar6,local_58.m_str,uVar7);
    *ppcVar6 = *ppcVar6 + uVar7;
  }
  T::T(&local_48,*(char **)(LogLevelName + (ulong)level * 8),6);
  uVar7 = (ulong)(int)local_48.m_len;
  if (uVar7 < (ulong)(long)((int)ppcVar6 - (int)*ppcVar6)) {
    memcpy(*ppcVar6,local_48.m_str,uVar7);
    *ppcVar6 = *ppcVar6 + uVar7;
  }
  if (savedErrno != 0) {
    pcVar4 = sz_strerror_tl(savedErrno);
    this_00 = LogStream::operator<<(local_38,pcVar4);
    pcVar4 = (this_00->m_buffer).m_cur;
    ppcVar6 = &(this_00->m_buffer).m_cur;
    if (8 < (uint)((int)ppcVar6 - (int)pcVar4)) {
      builtin_strncpy(pcVar4," (errno=",8);
      *ppcVar6 = *ppcVar6 + 8;
    }
    pLVar5 = LogStream::operator<<(this_00,savedErrno);
    pcVar4 = (pLVar5->m_buffer).m_cur;
    ppcVar6 = &(pLVar5->m_buffer).m_cur;
    if (2 < (uint)((int)ppcVar6 - (int)pcVar4)) {
      pcVar4[0] = ')';
      pcVar4[1] = ' ';
      *ppcVar6 = *ppcVar6 + 2;
    }
  }
  return;
}

Assistant:

Logger::Impl::Impl(LogLevel level, int savedErrno, const SourceFile& file, int line): 
	m_time(Timestamp::now()),
	m_stream(),
	m_level(level),
	m_line(line),
	m_basename(file)
{
	// 写入时间字符串
	formatTime();
	// 尝试获取线程id
	CurrentThread::tid();
	// 写入线程id字符串
	m_stream << T(CurrentThread::tidString(), CurrentThread::tidStringLength());
	// 写入日志等级字符串
	m_stream << T(LogLevelName[level], 6);
	// 有errno，写入错误原因
	if (savedErrno != 0)
	{
		m_stream << sz_strerror_tl(savedErrno) << " (errno=" << savedErrno << ") ";
	}
}